

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

void __thiscall
ValidationCache::ValidationCache
          (ValidationCache *this,size_t script_execution_cache_bytes,size_t signature_cache_bytes)

{
  long lVar1;
  _Head_base<0UL,_std::atomic<unsigned_char>_*,_false> _Var2;
  ulong uVar3;
  long in_FS_OFFSET;
  string_view source_file;
  Span<unsigned_char> bytes;
  string_view logging_function;
  ulong local_78;
  ulong local_70;
  uint32_t local_68 [2];
  long local_60;
  uint256 nonce;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA256::CSHA256(&this->m_script_execution_cache_hasher);
  (this->m_script_execution_cache).collection_flags.mem._M_t.
  super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
  .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl =
       (atomic<unsigned_char> *)0x0;
  (this->m_script_execution_cache).table.super__Vector_base<uint256,_std::allocator<uint256>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_script_execution_cache).table.super__Vector_base<uint256,_std::allocator<uint256>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_script_execution_cache).table.
           super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
           _M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_script_execution_cache).table.
           super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage + 4) = 0;
  _Var2._M_head_impl = (atomic<unsigned_char> *)operator_new__(0);
  (this->m_script_execution_cache).collection_flags.mem._M_t.
  super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
  .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl = _Var2._M_head_impl;
  (this->m_script_execution_cache).epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(undefined8 *)
   ((long)&(this->m_script_execution_cache).epoch_flags.super__Bvector_base<std::allocator<bool>_>.
           _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base + 8) = 0;
  (this->m_script_execution_cache).epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(undefined8 *)
   ((long)&(this->m_script_execution_cache).epoch_flags.super__Bvector_base<std::allocator<bool>_>.
           _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) = 0;
  (this->m_script_execution_cache).epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this->m_script_execution_cache).epoch_heuristic_counter = 0;
  (this->m_script_execution_cache).epoch_size = 0;
  (this->m_script_execution_cache).depth_limit = '\0';
  SignatureCache::SignatureCache(&this->m_signature_cache,signature_cache_bytes);
  nonce.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  bytes.m_size = 0x20;
  bytes.m_data = (uchar *)&nonce;
  GetRandBytes(bytes);
  CSHA256::Write(&this->m_script_execution_cache_hasher,(uchar *)&nonce,0x20);
  CSHA256::Write(&this->m_script_execution_cache_hasher,(uchar *)&nonce,0x20);
  uVar3 = script_execution_cache_bytes >> 5;
  if (0xfffffffe < uVar3) {
    uVar3 = 0xffffffff;
  }
  local_68[0] = CuckooCache::cache<uint256,_SignatureCacheHasher>::setup
                          (&this->m_script_execution_cache,(uint32_t)uVar3);
  local_60 = (ulong)local_68[0] << 5;
  local_70 = (ulong)(local_68[0] >> 0xf);
  local_78 = script_execution_cache_bytes >> 0x14;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
  ;
  source_file._M_len = 0x5e;
  logging_function._M_str = "ValidationCache";
  logging_function._M_len = 0xf;
  LogPrintFormatInternal<unsigned_long,unsigned_long,unsigned_int>
            (logging_function,source_file,0x83c,ALL,Info,(ConstevalFormatString<3U>)0xfb1409,
             &local_70,&local_78,local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ValidationCache::ValidationCache(const size_t script_execution_cache_bytes, const size_t signature_cache_bytes)
    : m_signature_cache{signature_cache_bytes}
{
    // Setup the salted hasher
    uint256 nonce = GetRandHash();
    // We want the nonce to be 64 bytes long to force the hasher to process
    // this chunk, which makes later hash computations more efficient. We
    // just write our 32-byte entropy twice to fill the 64 bytes.
    m_script_execution_cache_hasher.Write(nonce.begin(), 32);
    m_script_execution_cache_hasher.Write(nonce.begin(), 32);

    const auto [num_elems, approx_size_bytes] = m_script_execution_cache.setup_bytes(script_execution_cache_bytes);
    LogPrintf("Using %zu MiB out of %zu MiB requested for script execution cache, able to store %zu elements\n",
              approx_size_bytes >> 20, script_execution_cache_bytes >> 20, num_elems);
}